

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

_Bool str_is_printable(char *value)

{
  bool bVar1;
  char cVar2;
  uchar *_value;
  char *pcVar3;
  bool bVar4;
  
  cVar2 = *value;
  if (cVar2 == '\0') {
    return true;
  }
  pcVar3 = value + 1;
  do {
    bVar4 = (byte)(cVar2 - 0x20U) < 0xdf;
    bVar1 = bVar4 && cVar2 != '\x7f';
    if (!bVar4 || cVar2 == '\x7f') {
      return bVar1;
    }
    cVar2 = *pcVar3;
    pcVar3 = pcVar3 + 1;
  } while (cVar2 != '\0');
  return bVar1;
}

Assistant:

bool
str_is_printable(const char *value) {
  const unsigned char *_value;

  _value = (const unsigned char *)value;

  while (*_value) {
    if (!str_char_is_printable(*_value)) {
      return false;
    }
    _value++;
  }
  return true;
}